

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileContext.cpp
# Opt level: O1

ssize_t __thiscall higan::FileContext::ReadFileToBuffer(FileContext *this,Buffer *buffer)

{
  FileForRead *this_00;
  size_t sVar1;
  ssize_t sVar2;
  size_t sVar3;
  
  sVar2 = -1;
  if ((buffer != (Buffer *)0x0) &&
     (this_00 = (this->file_ptr_).super___shared_ptr<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr, this_00 != (FileForRead *)0x0)) {
    if (this->read_over_ == false) {
      sVar2 = FileForRead::ReadFileToBuffer(this_00,buffer);
      if (0 < sVar2) {
        sVar3 = this->sum_read_from_cache_ + sVar2;
        this->sum_read_from_cache_ = sVar3;
        sVar1 = FileForRead::GetFileSize
                          ((this->file_ptr_).
                           super___shared_ptr<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          );
        if (sVar3 == sVar1) {
          this->read_over_ = true;
        }
      }
    }
    else {
      sVar2 = 0;
    }
  }
  return sVar2;
}

Assistant:

ssize_t FileContext::ReadFileToBuffer(Buffer* buffer)
{
	if (!buffer || !file_ptr_)
	{
		return -1;
	}

	if (read_over_)
	{
		return 0;
	}

	ssize_t read_size = file_ptr_->ReadFileToBuffer(buffer);
	if (read_size > 0)
	{
		sum_read_from_cache_ += read_size;
		if (sum_read_from_cache_ == file_ptr_->GetFileSize())
		{
			read_over_ = true;
		}
	}

	return read_size;
}